

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.cpp
# Opt level: O2

void __thiscall zmq::dist_t::reverse_match(dist_t *this)

{
  size_type index2_;
  size_type i;
  size_type index1_;
  
  index1_ = this->_matching;
  this->_matching = 0;
  for (; index1_ < this->_eligible; index1_ = index1_ + 1) {
    index2_ = this->_matching;
    this->_matching = index2_ + 1;
    array_t<zmq::pipe_t,_2>::swap(&this->_pipes,index1_,index2_);
  }
  return;
}

Assistant:

void zmq::dist_t::reverse_match ()
{
    const pipes_t::size_type prev_matching = _matching;

    // Reset matching to 0
    unmatch ();

    // Mark all matching pipes as not matching and vice-versa.
    // To do this, push all pipes that are eligible but not
    // matched - i.e. between "matching" and "eligible" -
    // to the beginning of the queue.
    for (pipes_t::size_type i = prev_matching; i < _eligible; ++i) {
        _pipes.swap (i, _matching++);
    }
}